

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t spvtools::val::ImagePass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  Function *pFVar5;
  anon_class_4_1_64e6d48c local_74;
  function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_70;
  anon_class_4_1_64e6d48c local_4c;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_48;
  Op local_24;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  bVar2 = anon_unknown_0::IsImplicitLod(local_24);
  pIVar1 = inst_local;
  if (bVar2) {
    pFVar5 = Instruction::function(pIStack_20);
    uVar3 = Function::id(pFVar5);
    pFVar5 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
    local_4c.opcode = local_24;
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ImagePass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_48,&local_4c);
    Function::RegisterExecutionModelLimitation(pFVar5,&local_48);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_48);
    pIVar1 = inst_local;
    pFVar5 = Instruction::function(pIStack_20);
    uVar3 = Function::id(pFVar5);
    pFVar5 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
    local_74.opcode = local_24;
    std::
    function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>
    ::
    function<spvtools::val::ImagePass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1,void>
              ((function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>
                *)&local_70,&local_74);
    Function::RegisterLimitation(pFVar5,&local_70);
    std::
    function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_70);
  }
  if (local_24 == OpTypeImage) {
    sVar4 = anon_unknown_0::ValidateTypeImage((ValidationState_t *)inst_local,pIStack_20);
    return sVar4;
  }
  if (local_24 == OpTypeSampledImage) {
    sVar4 = anon_unknown_0::ValidateTypeSampledImage((ValidationState_t *)inst_local,pIStack_20);
    return sVar4;
  }
  if (local_24 == OpImageTexelPointer) {
    sVar4 = anon_unknown_0::ValidateImageTexelPointer((ValidationState_t *)inst_local,pIStack_20);
    return sVar4;
  }
  if (local_24 == OpSampledImage) {
    sVar4 = anon_unknown_0::ValidateSampledImage((ValidationState_t *)inst_local,pIStack_20);
    return sVar4;
  }
  if (local_24 - OpImageSampleImplicitLod < 2) {
LAB_00b33cbc:
    __local._4_4_ = anon_unknown_0::ValidateImageLod((ValidationState_t *)inst_local,pIStack_20);
  }
  else {
    if (1 < local_24 - OpImageSampleDrefImplicitLod) {
      if (local_24 - OpImageSampleProjImplicitLod < 2) goto LAB_00b33cbc;
      if (1 < local_24 - OpImageSampleProjDrefImplicitLod) {
        if (local_24 == OpImageFetch) {
LAB_00b33ce6:
          sVar4 = anon_unknown_0::ValidateImageFetch((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 - OpImageGather < 2) {
LAB_00b33cfb:
          sVar4 = anon_unknown_0::ValidateImageGather((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 == OpImageRead) {
LAB_00b33d10:
          sVar4 = anon_unknown_0::ValidateImageRead((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 == OpImageWrite) {
          sVar4 = anon_unknown_0::ValidateImageWrite((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 == OpImage) {
          sVar4 = anon_unknown_0::ValidateImage((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 - OpImageQueryFormat < 2) {
          sVar4 = anon_unknown_0::ValidateImageQueryFormatOrOrder
                            ((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 == OpImageQuerySizeLod) {
          sVar4 = anon_unknown_0::ValidateImageQuerySizeLod
                            ((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 == OpImageQuerySize) {
          sVar4 = anon_unknown_0::ValidateImageQuerySize((ValidationState_t *)inst_local,pIStack_20)
          ;
          return sVar4;
        }
        if (local_24 == OpImageQueryLod) {
          sVar4 = anon_unknown_0::ValidateImageQueryLod((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 - OpImageQueryLevels < 2) {
          sVar4 = anon_unknown_0::ValidateImageQueryLevelsOrSamples
                            ((ValidationState_t *)inst_local,pIStack_20);
          return sVar4;
        }
        if (local_24 - OpImageSparseSampleImplicitLod < 2) goto LAB_00b33cbc;
        if (1 < local_24 - OpImageSparseSampleDrefImplicitLod) {
          if (local_24 - OpImageSparseSampleProjImplicitLod < 4) {
            sVar4 = anon_unknown_0::ValidateImageSparseLod
                              ((ValidationState_t *)inst_local,pIStack_20);
            return sVar4;
          }
          if (local_24 == OpImageSparseFetch) goto LAB_00b33ce6;
          if (local_24 - OpImageSparseGather < 2) goto LAB_00b33cfb;
          if (local_24 == OpImageSparseTexelsResident) {
            sVar4 = anon_unknown_0::ValidateImageSparseTexelsResident
                              ((ValidationState_t *)inst_local,pIStack_20);
            return sVar4;
          }
          if (local_24 != OpImageSparseRead) {
            if ((3 < local_24 - OpImageSampleWeightedQCOM) &&
               (3 < local_24 - OpImageBlockMatchWindowSSDQCOM)) {
              return SPV_SUCCESS;
            }
            sVar4 = anon_unknown_0::ValidateImageProcessingQCOM
                              ((ValidationState_t *)inst_local,pIStack_20);
            return sVar4;
          }
          goto LAB_00b33d10;
        }
      }
    }
    __local._4_4_ = anon_unknown_0::ValidateImageDrefLod((ValidationState_t *)inst_local,pIStack_20)
    ;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ImagePass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (IsImplicitLod(opcode)) {
    _.function(inst->function()->id())
        ->RegisterExecutionModelLimitation([opcode](spv::ExecutionModel model,
                                                    std::string* message) {
          if (model != spv::ExecutionModel::Fragment &&
              model != spv::ExecutionModel::GLCompute &&
              model != spv::ExecutionModel::MeshEXT &&
              model != spv::ExecutionModel::TaskEXT) {
            if (message) {
              *message =
                  std::string(
                      "ImplicitLod instructions require Fragment, GLCompute, "
                      "MeshEXT or TaskEXT execution model: ") +
                  spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
    _.function(inst->function()->id())
        ->RegisterLimitation([opcode](const ValidationState_t& state,
                                      const Function* entry_point,
                                      std::string* message) {
          const auto* models = state.GetExecutionModels(entry_point->id());
          const auto* modes = state.GetExecutionModes(entry_point->id());
          if (models &&
              (models->find(spv::ExecutionModel::GLCompute) != models->end() ||
               models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
               models->find(spv::ExecutionModel::TaskEXT) != models->end()) &&
              (!modes ||
               (modes->find(spv::ExecutionMode::DerivativeGroupLinearKHR) ==
                    modes->end() &&
                modes->find(spv::ExecutionMode::DerivativeGroupQuadsKHR) ==
                    modes->end()))) {
            if (message) {
              *message = std::string(
                             "ImplicitLod instructions require "
                             "DerivativeGroupQuadsKHR "
                             "or DerivativeGroupLinearKHR execution mode for "
                             "GLCompute, "
                             "MeshEXT or TaskEXT execution model: ") +
                         spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
  }

  switch (opcode) {
    case spv::Op::OpTypeImage:
      return ValidateTypeImage(_, inst);
    case spv::Op::OpTypeSampledImage:
      return ValidateTypeSampledImage(_, inst);
    case spv::Op::OpSampledImage:
      return ValidateSampledImage(_, inst);
    case spv::Op::OpImageTexelPointer:
      return ValidateImageTexelPointer(_, inst);

    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
      return ValidateImageLod(_, inst);

    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
      return ValidateImageDrefLod(_, inst);

    case spv::Op::OpImageFetch:
    case spv::Op::OpImageSparseFetch:
      return ValidateImageFetch(_, inst);

    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
      return ValidateImageGather(_, inst);

    case spv::Op::OpImageRead:
    case spv::Op::OpImageSparseRead:
      return ValidateImageRead(_, inst);

    case spv::Op::OpImageWrite:
      return ValidateImageWrite(_, inst);

    case spv::Op::OpImage:
      return ValidateImage(_, inst);

    case spv::Op::OpImageQueryFormat:
    case spv::Op::OpImageQueryOrder:
      return ValidateImageQueryFormatOrOrder(_, inst);

    case spv::Op::OpImageQuerySizeLod:
      return ValidateImageQuerySizeLod(_, inst);
    case spv::Op::OpImageQuerySize:
      return ValidateImageQuerySize(_, inst);
    case spv::Op::OpImageQueryLod:
      return ValidateImageQueryLod(_, inst);

    case spv::Op::OpImageQueryLevels:
    case spv::Op::OpImageQuerySamples:
      return ValidateImageQueryLevelsOrSamples(_, inst);

    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return ValidateImageSparseLod(_, inst);

    case spv::Op::OpImageSparseTexelsResident:
      return ValidateImageSparseTexelsResident(_, inst);

    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
      return ValidateImageProcessingQCOM(_, inst);

    default:
      break;
  }

  return SPV_SUCCESS;
}